

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O1

confirm * __thiscall
lest::for_test<lest::confirm>(lest *this,tests *specification,texts *in,confirm *perform,int n)

{
  bool bVar1;
  int iVar2;
  confirm *pcVar3;
  int iVar4;
  fd_set *__exceptfds;
  int iVar5;
  fd_set *__writefds;
  undefined4 in_register_00000084;
  long *plVar6;
  bool bVar7;
  long *local_c0 [2];
  long local_b0 [2];
  lest *local_a0;
  tests *local_98;
  long *local_90;
  test local_88;
  
  iVar4 = (int)perform;
  __exceptfds = (fd_set *)CONCAT71((int7)((ulong)perform >> 8),iVar4 < 1);
  if (iVar4 == -1 || iVar4 >= 1) {
    iVar5 = 0;
    local_a0 = this;
    local_98 = specification;
    do {
      plVar6 = *(long **)local_a0;
      local_90 = *(long **)(local_a0 + 8);
      bVar7 = plVar6 == local_90;
      while (!bVar7) {
        local_c0[0] = local_b0;
        std::__cxx11::string::_M_construct<char*>((string *)local_c0,*plVar6,plVar6[1] + *plVar6);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&stack0xffffffffffffffb8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_98);
        iVar2 = select((int)(string *)local_c0,(fd_set *)&stack0xffffffffffffffb8,__writefds,
                       __exceptfds,(timeval *)CONCAT44(in_register_00000084,n));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&stack0xffffffffffffffb8);
        if (local_c0[0] != local_b0) {
          operator_delete(local_c0[0],local_b0[0] + 1);
        }
        if ((char)iVar2 == '\0') {
LAB_001188cc:
          bVar1 = true;
        }
        else {
          local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
          std::__cxx11::string::_M_construct<char*>((string *)&local_88,*plVar6,plVar6[1] + *plVar6)
          ;
          std::function<void_(lest::env_&)>::function
                    (&local_88.behaviour,(function<void_(lest::env_&)> *)(plVar6 + 4));
          pcVar3 = confirm::operator()((confirm *)in,&local_88);
          iVar2 = pcVar3->failures;
          bVar1 = (pcVar3->output).opt.abort;
          if (local_88.behaviour.super__Function_base._M_manager != (_Manager_type)0x0) {
            (*local_88.behaviour.super__Function_base._M_manager)
                      ((_Any_data *)&local_88.behaviour,(_Any_data *)&local_88.behaviour,
                       __destroy_functor);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88.name._M_dataplus._M_p != &local_88.name.field_2) {
            operator_delete(local_88.name._M_dataplus._M_p,
                            local_88.name.field_2._M_allocated_capacity + 1);
          }
          if ((0 < iVar2 & bVar1) == 0) goto LAB_001188cc;
          bVar1 = false;
        }
        if (!bVar1) break;
        plVar6 = plVar6 + 8;
        bVar7 = plVar6 == local_90;
      }
      if (!bVar7) {
        return (confirm *)in;
      }
      iVar5 = iVar5 + 1;
      __exceptfds = (fd_set *)(ulong)CONCAT31((int3)((ulong)perform >> 8),iVar4 <= iVar5);
    } while (iVar4 == -1 || iVar4 > iVar5);
  }
  return (confirm *)in;
}

Assistant:

Action && for_test( tests specification, texts in, Action && perform, int n = 1 )
{
    for ( int i = 0; indefinite( n ) || i < n; ++i )
    {
        for ( auto & testing : specification )
        {
            if ( select( testing.name, in ) )
                if ( abort( perform( testing ) ) )
                    return std::move( perform );
        }
    }
    return std::move( perform );
}